

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

uint SOIL_create_OGL_texture
               (uchar *data,int width,int height,int channels,uint reuse_texture_ID,uint flags)

{
  uint uVar1;
  
  uVar1 = SOIL_internal_create_OGL_texture
                    (data,width,height,channels,reuse_texture_ID,flags,0xde1,0xde1,0xd33);
  return uVar1;
}

Assistant:

unsigned int
	SOIL_create_OGL_texture
	(
		const unsigned char *const data,
		int width, int height, int channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	wrapper function for 2D textures	*/
	return SOIL_internal_create_OGL_texture(
				data, width, height, channels,
				reuse_texture_ID, flags,
				GL_TEXTURE_2D, GL_TEXTURE_2D,
				GL_MAX_TEXTURE_SIZE );
}